

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<char>::append<std::move_iterator<char*>,void>
          (SmallVectorImpl<char> *this,move_iterator<char_*> in_start,move_iterator<char_*> in_end)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  iterator Dest;
  size_type NumInputs;
  SmallVectorImpl<char> *this_local;
  move_iterator<char_*> in_end_local;
  move_iterator<char_*> in_start_local;
  
  uVar1 = std::distance<std::move_iterator<char*>>(in_start,in_end);
  sVar2 = SmallVectorBase::capacity((SmallVectorBase *)this);
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  if (sVar2 - sVar3 < uVar1) {
    sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
    SmallVectorTemplateBase<char,_true>::grow
              (&this->super_SmallVectorTemplateBase<char,_true>,sVar2 + uVar1);
  }
  Dest = SmallVectorTemplateCommon<char,_void>::end((SmallVectorTemplateCommon<char,_void> *)this);
  SmallVectorTemplateBase<char,true>::uninitialized_copy<std::move_iterator<char*>,char*>
            (in_start,in_end,Dest);
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar2 + uVar1);
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }